

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmerdb.cpp
# Opt level: O0

uint64_t find_kmer_db_vector(vector<unsigned_long,_std::allocator<unsigned_long>_> *kmers,
                            uint64_t kmer,uint32_t kmer_size)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  uint64_t ret;
  tuple<unsigned_long,_unsigned_long> local_40;
  uint64_t flag;
  uint64_t k;
  uint64_t uStack_18;
  uint32_t kmer_size_local;
  uint64_t kmer_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *kmers_local;
  
  k._4_4_ = kmer_size;
  uStack_18 = kmer;
  kmer_local = (uint64_t)kmers;
  is_canonized_kmer_representation_flag((uint64_t *)&local_40,(uint32 *)&stack0xffffffffffffffe8);
  std::tie<unsigned_long,unsigned_long>(&ret,&flag);
  std::tuple<unsigned_long&,unsigned_long&>::operator=
            ((tuple<unsigned_long&,unsigned_long&> *)&ret,&local_40);
  iVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)kmer_local);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)kmer_local);
  bVar1 = std::
          binary_search<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,find_kmer_db_vector(std::vector<unsigned_long,std::allocator<unsigned_long>>*,unsigned_long,unsigned_int)::__0>
                    (iVar2._M_current,iVar3._M_current,&flag);
  return (ulong)bVar1;
}

Assistant:

uint64_t find_kmer_db_vector(vector<uint64_t> *kmers , uint64_t kmer, uint32_t kmer_size){
    uint64_t k, flag;
    tie(k, flag)  = is_canonized_kmer_representation_flag(kmer, kmer_size);
    
    uint64_t ret =(uint64_t ) binary_search(kmers->begin(), kmers->end(), k, 
        [](const uint64_t & a, const uint64_t & b) -> bool
		{return (a&0x3FFFFFFFFFFFFFFF) < (b&0x3FFFFFFFFFFFFFFF);});

    return ret;
}